

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::SetNavIDWithRectRel(ImGuiID id,int nav_layer,ImGuiID focus_scope_id,ImRect *rect_rel)

{
  ImGuiContext *pIVar1;
  ImRect *pIVar2;
  ImVec2 *in_RCX;
  ImGuiID in_EDX;
  int in_ESI;
  ImGuiContext *g;
  int in_stack_fffffffffffffff0;
  
  pIVar1 = GImGui;
  SetNavID(in_EDX,in_stack_fffffffffffffff0,(ImGuiID)((ulong)in_RCX >> 0x20));
  pIVar2 = pIVar1->NavWindow->NavRectRel + in_ESI;
  pIVar2->Min = *in_RCX;
  pIVar2->Max = in_RCX[1];
  pIVar1->NavMousePosDirty = true;
  pIVar1->NavDisableHighlight = false;
  pIVar1->NavDisableMouseHover = true;
  return;
}

Assistant:

void ImGui::SetNavIDWithRectRel(ImGuiID id, int nav_layer, ImGuiID focus_scope_id, const ImRect& rect_rel)
{
    ImGuiContext& g = *GImGui;
    SetNavID(id, nav_layer, focus_scope_id);
    g.NavWindow->NavRectRel[nav_layer] = rect_rel;
    g.NavMousePosDirty = true;
    g.NavDisableHighlight = false;
    g.NavDisableMouseHover = true;
}